

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

void ucnv_MBCSLoad(UConverterSharedData *sharedData,UConverterLoadArgs *pArgs,uint8_t *raw,
                  UErrorCode *pErrorCode)

{
  UConverterMBCSTable *mbcsTable;
  char cVar1;
  ushort uVar2;
  int32_t *piVar3;
  uint16_t *puVar4;
  UConverterStaticData *pUVar5;
  byte bVar6;
  UChar UVar7;
  UConverterSharedData *sharedData_00;
  void *context;
  uint16_t *puVar8;
  UConverterImpl *pUVar9;
  int32_t (*__dest) [256];
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  UDataInfo info;
  UConverterLoadArgs args;
  uint8_t uVar19;
  UErrorCode *pErrorCode_00;
  UDataInfo local_cc;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  uint32_t uStack_ac;
  undefined1 local_a8 [12];
  undefined4 uStack_9c;
  char *local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (*raw == '\x04') {
    uVar11 = 0x20;
    bVar18 = true;
  }
  else {
    if (((*raw != '\x05') || (raw[1] < 3)) ||
       (uVar12 = *(uint *)(raw + 0x20), (uVar12 & 0xff80) != 0)) goto LAB_0017305a;
    bVar18 = (uVar12 & 0x40) == 0;
    uVar11 = (ulong)((uVar12 & 0x3f) << 2);
  }
  uVar12 = *(uint *)(raw + 0x18);
  bVar6 = (byte)uVar12;
  (sharedData->mbcs).outputType = bVar6;
  if (!(bool)(bVar6 != 0 | bVar18)) {
LAB_0017305a:
    *pErrorCode = U_INVALID_TABLE_FORMAT;
    return;
  }
  if (0xff < uVar12) {
    (sharedData->mbcs).extIndexes = (int32_t *)(raw + (uVar12 >> 8));
  }
  if (0xe < bVar6) goto LAB_0017305a;
  mbcsTable = &sharedData->mbcs;
  if ((0x130fU >> (uVar12 & 0x1f) & 1) == 0) {
    if ((uVar12 & 0xff) != 0xe) goto LAB_0017305a;
    _local_a8 = (undefined1  [16])0x0;
    local_98 = (char *)0x0;
    stack0xffffffffffffff4c = SUB1612((undefined1  [16])0x0,4);
    local_b8._0_4_ = 0x28;
    piVar3 = (sharedData->mbcs).extIndexes;
    if (piVar3 == (int32_t *)0x0) goto LAB_0017305a;
    if (pArgs->nestedLoads != 1) {
      *pErrorCode = U_INVALID_TABLE_FILE;
      return;
    }
    iVar16 = strcmp((char *)(raw + uVar11),sharedData->staticData->name);
    if (iVar16 == 0) goto LAB_0017305a;
    uStack_b0._0_1_ = pArgs->onlyTestIsLoadable;
    local_b8 = (undefined1  [8])0x200000028;
    uStack_b0._2_2_ = pArgs->reserved;
    uStack_ac = pArgs->options;
    stack0xffffffffffffff60 = raw + uVar11;
    local_a8._0_8_ = pArgs->pkg;
    sharedData_00 = ucnv_load_63((UConverterLoadArgs *)local_b8,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      return;
    }
    if ((sharedData_00->staticData->conversionType != '\x02') ||
       ((sharedData_00->mbcs).baseSharedData != (UConverterSharedData *)0x0)) {
      ucnv_unload_63(sharedData_00);
      goto LAB_0017305a;
    }
    if (pArgs->onlyTestIsLoadable != '\0') {
      ucnv_unload_63(sharedData_00);
      return;
    }
    memcpy(mbcsTable,&sharedData_00->mbcs,0xf8);
    (sharedData->mbcs).baseSharedData = sharedData_00;
    (sharedData->mbcs).extIndexes = piVar3;
    (sharedData->mbcs).swapLFNLStateTable = (int32_t (*) [256])0x0;
    (sharedData->mbcs).swapLFNLFromUnicodeBytes = (uint8_t *)0x0;
    (sharedData->mbcs).reconstitutedData = (uint8_t *)0x0;
    (sharedData->mbcs).swapLFNLName = (char *)0x0;
    cVar1 = sharedData->staticData->conversionType;
    if ((cVar1 == '\x01') ||
       ((cVar1 == '\x02' && ('\x01' < sharedData->staticData->minBytesPerChar)))) {
      if ((sharedData_00->mbcs).outputType == '\f') {
        uVar12 = (*(sharedData->mbcs).stateTable)[0xe];
        if (((uVar12 & 0x80f00000) == 0x80800000) && (uVar12 = uVar12 >> 0x18 & 0x7f, uVar12 != 0))
        {
          (sharedData->mbcs).dbcsOnlyState = (uint8_t)uVar12;
          (sharedData->mbcs).outputType = 0xdb;
        }
      }
      else {
        pUVar5 = sharedData_00->staticData;
        if ((((pUVar5->conversionType == '\x02') && (pUVar5->minBytesPerChar == '\x01')) &&
            (pUVar5->maxBytesPerChar == '\x02')) &&
           (bVar6 = mbcsTable->countStates, -1 < (char)bVar6)) {
          uVar19 = (uint8_t)(bVar6 + 1);
          __dest = (int32_t (*) [256])uprv_malloc_63((ulong)((bVar6 + 1) * 0x400));
          if (__dest == (int32_t (*) [256])0x0) {
            ucnv_unload_63(sharedData_00);
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            memcpy(__dest,(sharedData->mbcs).stateTable,(ulong)bVar6 << 10);
            lVar10 = 0;
            do {
              if ((*__dest)[lVar10] < 0) {
                (*__dest)[lVar10] = (uint)bVar6 << 0x18;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x100);
            lVar10 = 0;
            do {
              __dest[bVar6][lVar10] = -0x7f900000;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x100);
            (sharedData->mbcs).stateTable = __dest;
            (sharedData->mbcs).countStates = uVar19;
            (sharedData->mbcs).stateTableOwned = '\x01';
            (sharedData->mbcs).outputType = 0xdb;
          }
          if (__dest == (int32_t (*) [256])0x0) {
            return;
          }
        }
      }
    }
  }
  else {
    if (pArgs->onlyTestIsLoadable != '\0') {
      return;
    }
    uVar12 = *(uint *)(raw + 4);
    (sharedData->mbcs).countStates = (uint8_t)uVar12;
    (sharedData->mbcs).countToUFallbacks = *(uint32_t *)(raw + 8);
    (sharedData->mbcs).stateTable = (int32_t (*) [256])(raw + uVar11);
    (sharedData->mbcs).toUFallbacks =
         (_MBCSToUFallback *)((int32_t (*) [256])(raw + uVar11) + uVar12);
    (sharedData->mbcs).unicodeCodeUnits = (uint16_t *)(raw + *(uint *)(raw + 0xc));
    (sharedData->mbcs).fromUnicodeTable = (uint16_t *)(raw + *(uint *)(raw + 0x10));
    (sharedData->mbcs).fromUnicodeBytes = raw + *(uint *)(raw + 0x14);
    (sharedData->mbcs).fromUBytesLength = *(uint32_t *)(raw + 0x1c);
    local_cc.size = 0x14;
    udata_getInfo_63((UDataMemory *)sharedData->dataMemory,&local_cc);
    if ((6 < local_cc.formatVersion[0]) ||
       ((bVar6 = 3, local_cc.formatVersion[0] == 6 && (local_cc.formatVersion[1] != '\0')))) {
      bVar6 = sharedData->staticData->unicodeMask & 3;
    }
    (sharedData->mbcs).unicodeMask = bVar6;
    if ((2 < raw[1]) && (((sharedData->mbcs).unicodeMask & 2) == 0)) {
      if (mbcsTable->countStates == '\x01') {
        if (0xe < raw[2]) {
LAB_00173078:
          (sharedData->mbcs).utf8Friendly = '\x01';
          if (mbcsTable->countStates == '\x01') {
            puVar8 = (sharedData->mbcs).fromUnicodeTable;
            uVar12 = 0;
            uVar11 = 0;
            do {
              (sharedData->mbcs).sbcsIndex[uVar11] =
                   puVar8[(ulong)(uVar12 & 0x3c) + (ulong)puVar8[uVar11 >> 4 & 0xfffffff]];
              uVar11 = uVar11 + 1;
              uVar12 = uVar12 + 4;
            } while (uVar11 != 0x40);
            UVar7 = L'࿿';
          }
          else {
            if (bVar18) {
              uVar11 = (ulong)(sharedData->mbcs).fromUBytesLength;
            }
            else {
              uVar11 = 0;
            }
            (sharedData->mbcs).mbcsIndex =
                 (uint16_t *)((sharedData->mbcs).fromUnicodeBytes + uVar11);
            UVar7 = (ushort)raw[2] << 8 | 0xff;
          }
          (sharedData->mbcs).maxFastUChar = UVar7;
        }
      }
      else if (0xd6 < raw[2]) goto LAB_00173078;
    }
    uVar11 = 0;
    uVar12 = 0xffffffff;
    do {
      bVar6 = (byte)((uVar11 & 0xffffffff) >> 2) & 0x1f;
      uVar14 = -2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6;
      if (uVar11 + 0x80000000 == (ulong)(uint)(*(sharedData->mbcs).stateTable)[uVar11]) {
        uVar14 = 0xffffffff;
      }
      uVar12 = uVar12 & uVar14;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x80);
    (sharedData->mbcs).asciiRoundtrips = uVar12;
    if (!bVar18) {
      uVar14 = (sharedData->mbcs).unicodeMask & 1;
      iVar16 = *(int *)(raw + 0x10);
      iVar17 = *(int *)(raw + 0x14);
      context = (void *)(ulong)*(uint *)(raw + 0x24);
      uVar12 = uVar14 * 0x800 + 0x80;
      uVar11 = (ulong)(uVar12 + *(uint *)(raw + 0x24) * 4 + (sharedData->mbcs).fromUBytesLength);
      puVar8 = (uint16_t *)uprv_malloc_63(uVar11);
      (sharedData->mbcs).reconstitutedData = (uint8_t *)puVar8;
      if (puVar8 == (uint16_t *)0x0) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        uVar15 = uVar14 << 10 | 0x40;
        uVar14 = uVar15 >> 1;
        iVar16 = ((uint)(iVar17 - iVar16) >> 2) - uVar14;
        iVar17 = 0;
        memset(puVar8,0,uVar11);
        puVar4 = (sharedData->mbcs).fromUnicodeTable;
        memcpy(puVar8,puVar4,(ulong)uVar12);
        uVar11 = (ulong)(uVar15 * 2);
        pErrorCode_00 = (UErrorCode *)((long)puVar8 + uVar11);
        memcpy(pErrorCode_00 + (uint)((int)context - iVar16),(void *)((long)puVar4 + uVar11),
               (ulong)(uint)(iVar16 * 4));
        (sharedData->mbcs).fromUnicodeTable = puVar8;
        (sharedData->mbcs).fromUnicodeBytes = (uint8_t *)(pErrorCode_00 + (long)context);
        uVar12 = (uint)(ushort)(sharedData->mbcs).maxFastUChar;
        if (0x3e < uVar12) {
          lVar10 = 0;
          do {
            uVar11 = (ulong)puVar8[lVar10];
            if (uVar14 != puVar8[lVar10]) {
              puVar4 = (sharedData->mbcs).mbcsIndex;
              lVar13 = 0;
              do {
                uVar2 = *(ushort *)((long)puVar4 + lVar13 + (long)iVar17 * 2);
                if (uVar2 != 0) {
                  uVar15 = (uint)(uVar2 >> 4);
                  *(uint *)(puVar8 + uVar11 * 2 + lVar13 * 4) = uVar15;
                  *(uint *)(puVar8 + uVar11 * 2 + lVar13 * 4 + 2) = uVar15 + 1;
                  *(uint *)(puVar8 + uVar11 * 2 + lVar13 * 4 + 4) = uVar15 + 2;
                  *(uint *)(puVar8 + uVar11 * 2 + lVar13 * 4 + 6) = uVar15 + 3;
                }
                lVar13 = lVar13 + 2;
              } while ((int)lVar13 != 0x20);
            }
            iVar17 = iVar17 + 0x10;
            lVar10 = lVar10 + 1;
          } while (iVar17 < (int)(uVar12 + 1 >> 6));
        }
        local_48 = 0xffffffff;
        uStack_44 = 0xffffffff;
        uStack_40 = 0xffffffff;
        uStack_3c = 0xffffffff;
        local_58 = 0xffffffff;
        uStack_54 = 0xffffffff;
        uStack_50 = 0xffffffff;
        uStack_4c = 0xffffffff;
        local_68 = 0xffffffff;
        uStack_64 = 0xffffffff;
        uStack_60 = 0xffffffff;
        uStack_5c = 0xffffffff;
        local_78 = 0xffffffff;
        uStack_74 = 0xffffffff;
        uStack_70 = 0xffffffff;
        uStack_6c = 0xffffffff;
        local_88 = 0xffffffff;
        uStack_84 = 0xffffffff;
        uStack_80 = 0xffffffff;
        uStack_7c = 0xffffffff;
        local_98 = (char *)0xffffffffffffffff;
        uStack_90 = 0xffffffff;
        uStack_8c = 0xffffffff;
        local_a8._8_4_ = 0xffffffff;
        local_a8._0_8_ = 0xffffffffffffffff;
        uStack_9c = 0xffffffff;
        uStack_b0 = 0xffffffff;
        local_b8 = (undefined1  [8])0xffffffffffffffff;
        uStack_ac = 0xffffffff;
        getStateProp((sharedData->mbcs).stateTable,local_b8,0);
        if ((sharedData->mbcs).countStates != '\0') {
          uVar11 = 0;
          do {
            if ('?' < (char)local_b8[uVar11]) {
              enumToU(mbcsTable,local_b8,(int32_t)uVar11,0,0,(UConverterEnumToUCallback *)mbcsTable,
                      context,pErrorCode_00);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < mbcsTable->countStates);
        }
      }
    }
  }
  if ((sharedData->mbcs).utf8Friendly != '\0') {
    if (mbcsTable->countStates == '\x01') {
      pUVar9 = &_SBCSUTF8Impl;
    }
    else {
      if ((sharedData->mbcs).outputType != '\x01') goto LAB_00173358;
      pUVar9 = &_DBCSUTF8Impl;
    }
    sharedData->impl = pUVar9;
  }
LAB_00173358:
  uVar19 = (sharedData->mbcs).outputType;
  if ((uVar19 != 0xdb) && (uVar19 != '\f')) {
    return;
  }
  (sharedData->mbcs).asciiRoundtrips = 0;
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSLoad(UConverterSharedData *sharedData,
          UConverterLoadArgs *pArgs,
          const uint8_t *raw,
          UErrorCode *pErrorCode) {
    UDataInfo info;
    UConverterMBCSTable *mbcsTable=&sharedData->mbcs;
    _MBCSHeader *header=(_MBCSHeader *)raw;
    uint32_t offset;
    uint32_t headerLength;
    UBool noFromU=FALSE;

    if(header->version[0]==4) {
        headerLength=MBCS_HEADER_V4_LENGTH;
    } else if(header->version[0]==5 && header->version[1]>=3 &&
              (header->options&MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0) {
        headerLength=header->options&MBCS_OPT_LENGTH_MASK;
        noFromU=(UBool)((header->options&MBCS_OPT_NO_FROM_U)!=0);
    } else {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    mbcsTable->outputType=(uint8_t)header->flags;
    if(noFromU && mbcsTable->outputType==MBCS_OUTPUT_1) {
        *pErrorCode=U_INVALID_TABLE_FORMAT;
        return;
    }

    /* extension data, header version 4.2 and higher */
    offset=header->flags>>8;
    if(offset!=0) {
        mbcsTable->extIndexes=(const int32_t *)(raw+offset);
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_EXT_ONLY) {
        UConverterLoadArgs args=UCNV_LOAD_ARGS_INITIALIZER;
        UConverterSharedData *baseSharedData;
        const int32_t *extIndexes;
        const char *baseName;

        /* extension-only file, load the base table and set values appropriately */
        if((extIndexes=mbcsTable->extIndexes)==NULL) {
            /* extension-only file without extension */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        if(pArgs->nestedLoads!=1) {
            /* an extension table must not be loaded as a base table */
            *pErrorCode=U_INVALID_TABLE_FILE;
            return;
        }

        /* load the base table */
        baseName=(const char *)header+headerLength*4;
        if(0==uprv_strcmp(baseName, sharedData->staticData->name)) {
            /* forbid loading this same extension-only file */
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }

        /* TODO parse package name out of the prefix of the base name in the extension .cnv file? */
        args.size=sizeof(UConverterLoadArgs);
        args.nestedLoads=2;
        args.onlyTestIsLoadable=pArgs->onlyTestIsLoadable;
        args.reserved=pArgs->reserved;
        args.options=pArgs->options;
        args.pkg=pArgs->pkg;
        args.name=baseName;
        baseSharedData=ucnv_load(&args, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return;
        }
        if( baseSharedData->staticData->conversionType!=UCNV_MBCS ||
            baseSharedData->mbcs.baseSharedData!=NULL
        ) {
            ucnv_unload(baseSharedData);
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            ucnv_unload(baseSharedData);
            return;
        }

        /* copy the base table data */
        uprv_memcpy(mbcsTable, &baseSharedData->mbcs, sizeof(UConverterMBCSTable));

        /* overwrite values with relevant ones for the extension converter */
        mbcsTable->baseSharedData=baseSharedData;
        mbcsTable->extIndexes=extIndexes;

        /*
         * It would be possible to share the swapLFNL data with a base converter,
         * but the generated name would have to be different, and the memory
         * would have to be free'd only once.
         * It is easier to just create the data for the extension converter
         * separately when it is requested.
         */
        mbcsTable->swapLFNLStateTable=NULL;
        mbcsTable->swapLFNLFromUnicodeBytes=NULL;
        mbcsTable->swapLFNLName=NULL;

        /*
         * The reconstitutedData must be deleted only when the base converter
         * is unloaded.
         */
        mbcsTable->reconstitutedData=NULL;

        /*
         * Set a special, runtime-only outputType if the extension converter
         * is a DBCS version of a base converter that also maps single bytes.
         */
        if( sharedData->staticData->conversionType==UCNV_DBCS ||
                (sharedData->staticData->conversionType==UCNV_MBCS &&
                 sharedData->staticData->minBytesPerChar>=2)
        ) {
            if(baseSharedData->mbcs.outputType==MBCS_OUTPUT_2_SISO) {
                /* the base converter is SI/SO-stateful */
                int32_t entry;

                /* get the dbcs state from the state table entry for SO=0x0e */
                entry=mbcsTable->stateTable[0][0xe];
                if( MBCS_ENTRY_IS_FINAL(entry) &&
                    MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_CHANGE_ONLY &&
                    MBCS_ENTRY_FINAL_STATE(entry)!=0
                ) {
                    mbcsTable->dbcsOnlyState=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry);

                    mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
                }
            } else if(
                baseSharedData->staticData->conversionType==UCNV_MBCS &&
                baseSharedData->staticData->minBytesPerChar==1 &&
                baseSharedData->staticData->maxBytesPerChar==2 &&
                mbcsTable->countStates<=127
            ) {
                /* non-stateful base converter, need to modify the state table */
                int32_t (*newStateTable)[256];
                int32_t *state;
                int32_t i, count;

                /* allocate a new state table and copy the base state table contents */
                count=mbcsTable->countStates;
                newStateTable=(int32_t (*)[256])uprv_malloc((count+1)*1024);
                if(newStateTable==NULL) {
                    ucnv_unload(baseSharedData);
                    *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
                    return;
                }

                uprv_memcpy(newStateTable, mbcsTable->stateTable, count*1024);

                /* change all final single-byte entries to go to a new all-illegal state */
                state=newStateTable[0];
                for(i=0; i<256; ++i) {
                    if(MBCS_ENTRY_IS_FINAL(state[i])) {
                        state[i]=MBCS_ENTRY_TRANSITION(count, 0);
                    }
                }

                /* build the new all-illegal state */
                state=newStateTable[count];
                for(i=0; i<256; ++i) {
                    state[i]=MBCS_ENTRY_FINAL(0, MBCS_STATE_ILLEGAL, 0);
                }
                mbcsTable->stateTable=(const int32_t (*)[256])newStateTable;
                mbcsTable->countStates=(uint8_t)(count+1);
                mbcsTable->stateTableOwned=TRUE;

                mbcsTable->outputType=MBCS_OUTPUT_DBCS_ONLY;
            }
        }

        /*
         * unlike below for files with base tables, do not get the unicodeMask
         * from the sharedData; instead, use the base table's unicodeMask,
         * which we copied in the memcpy above;
         * this is necessary because the static data unicodeMask, especially
         * the UCNV_HAS_SUPPLEMENTARY flag, is part of the base table data
         */
    } else {
        /* conversion file with a base table; an additional extension table is optional */
        /* make sure that the output type is known */
        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_1:
        case MBCS_OUTPUT_2:
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4:
        case MBCS_OUTPUT_3_EUC:
        case MBCS_OUTPUT_4_EUC:
        case MBCS_OUTPUT_2_SISO:
            /* OK */
            break;
        default:
            *pErrorCode=U_INVALID_TABLE_FORMAT;
            return;
        }
        if(pArgs->onlyTestIsLoadable) {
            /*
             * Exit as soon as we know that we can load the converter
             * and the format is valid and supported.
             * The worst that can happen in the following code is a memory
             * allocation error.
             */
            return;
        }

        mbcsTable->countStates=(uint8_t)header->countStates;
        mbcsTable->countToUFallbacks=header->countToUFallbacks;
        mbcsTable->stateTable=(const int32_t (*)[256])(raw+headerLength*4);
        mbcsTable->toUFallbacks=(const _MBCSToUFallback *)(mbcsTable->stateTable+header->countStates);
        mbcsTable->unicodeCodeUnits=(const uint16_t *)(raw+header->offsetToUCodeUnits);

        mbcsTable->fromUnicodeTable=(const uint16_t *)(raw+header->offsetFromUTable);
        mbcsTable->fromUnicodeBytes=(const uint8_t *)(raw+header->offsetFromUBytes);
        mbcsTable->fromUBytesLength=header->fromUBytesLength;

        /*
         * converter versions 6.1 and up contain a unicodeMask that is
         * used here to select the most efficient function implementations
         */
        info.size=sizeof(UDataInfo);
        udata_getInfo((UDataMemory *)sharedData->dataMemory, &info);
        if(info.formatVersion[0]>6 || (info.formatVersion[0]==6 && info.formatVersion[1]>=1)) {
            /* mask off possible future extensions to be safe */
            mbcsTable->unicodeMask=(uint8_t)(sharedData->staticData->unicodeMask&3);
        } else {
            /* for older versions, assume worst case: contains anything possible (prevent over-optimizations) */
            mbcsTable->unicodeMask=UCNV_HAS_SUPPLEMENTARY|UCNV_HAS_SURROGATES;
        }

        /*
         * _MBCSHeader.version 4.3 adds utf8Friendly data structures.
         * Check for the header version, SBCS vs. MBCS, and for whether the
         * data structures are optimized for code points as high as what the
         * runtime code is designed for.
         * The implementation does not handle mapping tables with entries for
         * unpaired surrogates.
         */
        if( header->version[1]>=3 &&
            (mbcsTable->unicodeMask&UCNV_HAS_SURROGATES)==0 &&
            (mbcsTable->countStates==1 ?
                (header->version[2]>=(SBCS_FAST_MAX>>8)) :
                (header->version[2]>=(MBCS_FAST_MAX>>8))
            )
        ) {
            mbcsTable->utf8Friendly=TRUE;

            if(mbcsTable->countStates==1) {
                /*
                 * SBCS: Stage 3 is allocated in 64-entry blocks for U+0000..SBCS_FAST_MAX or higher.
                 * Build a table with indexes to each block, to be used instead of
                 * the regular stage 1/2 table.
                 */
                int32_t i;
                for(i=0; i<(SBCS_FAST_LIMIT>>6); ++i) {
                    mbcsTable->sbcsIndex[i]=mbcsTable->fromUnicodeTable[mbcsTable->fromUnicodeTable[i>>4]+((i<<2)&0x3c)];
                }
                /* set SBCS_FAST_MAX to reflect the reach of sbcsIndex[] even if header->version[2]>(SBCS_FAST_MAX>>8) */
                mbcsTable->maxFastUChar=SBCS_FAST_MAX;
            } else {
                /*
                 * MBCS: Stage 3 is allocated in 64-entry blocks for U+0000..MBCS_FAST_MAX or higher.
                 * The .cnv file is prebuilt with an additional stage table with indexes
                 * to each block.
                 */
                mbcsTable->mbcsIndex=(const uint16_t *)
                    (mbcsTable->fromUnicodeBytes+
                     (noFromU ? 0 : mbcsTable->fromUBytesLength));
                mbcsTable->maxFastUChar=(((UChar)header->version[2])<<8)|0xff;
            }
        }

        /* calculate a bit set of 4 ASCII characters per bit that round-trip to ASCII bytes */
        {
            uint32_t asciiRoundtrips=0xffffffff;
            int32_t i;

            for(i=0; i<0x80; ++i) {
                if(mbcsTable->stateTable[0][i]!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, i)) {
                    asciiRoundtrips&=~((uint32_t)1<<(i>>2));
                }
            }
            mbcsTable->asciiRoundtrips=asciiRoundtrips;
        }

        if(noFromU) {
            uint32_t stage1Length=
                mbcsTable->unicodeMask&UCNV_HAS_SUPPLEMENTARY ?
                    0x440 : 0x40;
            uint32_t stage2Length=
                (header->offsetFromUBytes-header->offsetFromUTable)/4-
                stage1Length/2;
            reconstituteData(mbcsTable, stage1Length, stage2Length, header->fullStage2Length, pErrorCode);
        }
    }

    /* Set the impl pointer here so that it is set for both extension-only and base tables. */
    if(mbcsTable->utf8Friendly) {
        if(mbcsTable->countStates==1) {
            sharedData->impl=&_SBCSUTF8Impl;
        } else {
            if(mbcsTable->outputType==MBCS_OUTPUT_2) {
                sharedData->impl=&_DBCSUTF8Impl;
            }
        }
    }

    if(mbcsTable->outputType==MBCS_OUTPUT_DBCS_ONLY || mbcsTable->outputType==MBCS_OUTPUT_2_SISO) {
        /*
         * MBCS_OUTPUT_DBCS_ONLY: No SBCS mappings, therefore ASCII does not roundtrip.
         * MBCS_OUTPUT_2_SISO: Bypass the ASCII fastpath to handle prevLength correctly.
         */
        mbcsTable->asciiRoundtrips=0;
    }
}